

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall google::protobuf::internal::ArenaImpl::Init(ArenaImpl *this)

{
  undefined8 uVar1;
  long lVar2;
  SerialArena *this_00;
  long in_RDI;
  ArenaImpl *unaff_retaddr;
  void *in_stack_00000008;
  Block *in_stack_00000010;
  SerialArena *serial;
  memory_order __b_1;
  memory_order __b;
  memory_order in_stack_ffffffffffffff44;
  __pointer_type in_stack_ffffffffffffff48;
  __pointer_type __p;
  atomic<google::protobuf::internal::ArenaImpl::SerialArena_*> *in_stack_ffffffffffffff50;
  ArenaImpl *this_01;
  
  LOCK();
  UNLOCK();
  lVar2 = lifecycle_id_generator_ + 1;
  *(long *)(in_RDI + 0x20) = lifecycle_id_generator_;
  lifecycle_id_generator_ = lVar2;
  std::atomic<google::protobuf::internal::ArenaImpl::SerialArena_*>::store
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
  std::atomic<google::protobuf::internal::ArenaImpl::SerialArena_*>::store
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
  if (*(long *)(in_RDI + 0x18) == 0) {
    std::operator&(memory_order_relaxed,__memory_order_mask);
    *(undefined8 *)(in_RDI + 0x10) = 0;
  }
  else {
    this_01 = (ArenaImpl *)0x0;
    Block::Block(*(Block **)(in_RDI + 0x18),*(size_t *)(in_RDI + 0x40),(Block *)0x0);
    __p = *(__pointer_type *)(in_RDI + 0x18);
    thread_cache();
    this_00 = SerialArena::New(in_stack_00000010,in_stack_00000008,unaff_retaddr);
    SerialArena::set_next(this_00,(SerialArena *)this_01);
    std::atomic<google::protobuf::internal::ArenaImpl::SerialArena_*>::store
              (&this_01->threads_,__p,in_stack_ffffffffffffff44);
    uVar1 = *(undefined8 *)(in_RDI + 0x40);
    std::operator&(memory_order_relaxed,__memory_order_mask);
    *(undefined8 *)(in_RDI + 0x10) = uVar1;
    CacheSerialArena(this_01,__p);
  }
  return;
}

Assistant:

void ArenaImpl::Init() {
  lifecycle_id_ =
      lifecycle_id_generator_.fetch_add(1, std::memory_order_relaxed);
  hint_.store(nullptr, std::memory_order_relaxed);
  threads_.store(nullptr, std::memory_order_relaxed);

  if (initial_block_) {
    // Thread which calls Init() owns the first block. This allows the
    // single-threaded case to allocate on the first block without having to
    // perform atomic operations.
    new (initial_block_) Block(options_.initial_block_size, NULL);
    SerialArena* serial =
        SerialArena::New(initial_block_, &thread_cache(), this);
    serial->set_next(NULL);
    threads_.store(serial, std::memory_order_relaxed);
    space_allocated_.store(options_.initial_block_size,
                           std::memory_order_relaxed);
    CacheSerialArena(serial);
  } else {
    space_allocated_.store(0, std::memory_order_relaxed);
  }
}